

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O2

void __thiscall CMU462::DynamicScene::Mesh::draw_faces(Mesh *this,bool smooth)

{
  list<CMU462::Face,_std::allocator<CMU462::Face>_> *plVar1;
  DrawStyle *pDVar2;
  _List_node_base *p_Var3;
  _List_node_base *p_Var4;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  Vector3D N;
  GLfloat white [4];
  Vector3D normal;
  
  white[0] = 1.0;
  white[1] = 1.0;
  white[2] = 1.0;
  white[3] = 1.0;
  local_88 = 0x3f800000;
  uStack_84 = 0x3f800000;
  uStack_80 = 0x3f800000;
  uStack_7c = 0x3f800000;
  if ((this->super_SceneObject).isGhosted == true) {
    local_88 = 0x3e800000;
    uStack_84 = 0x3e800000;
    uStack_80 = 0x3e800000;
    uStack_7c = 0x3e800000;
  }
  glEnable(0xb50);
  glEnable(0x4000);
  glLightfv(0x4000,0x1201,white);
  if (!smooth) {
    glMaterialfv(0x408,0x1201,&local_88);
  }
  plVar1 = &(this->mesh).faces;
  p_Var4 = (_List_node_base *)plVar1;
  while (p_Var4 = (((_List_base<CMU462::Face,_std::allocator<CMU462::Face>_> *)&p_Var4->_M_next)->
                  _M_impl)._M_node.super__List_node_base._M_next,
        p_Var4 != (_List_node_base *)plVar1) {
    glEnable(0x8037);
    glPolygonOffset(0x3f800000,0x3f800000);
    pDVar2 = get_draw_style(this,(HalfedgeElement *)(p_Var4 + 1));
    if ((!smooth) && (pDVar2 != this->defaultStyle)) {
      glDisable(0xb50);
      glColor4fv(&pDVar2->faceColor);
    }
    glBegin(9);
    Face::normal(&normal,(Face *)(p_Var4 + 1));
    if (!smooth) {
      glNormal3dv(&normal);
    }
    p_Var3 = p_Var4[0xb]._M_prev;
    do {
      if (smooth) {
        Vertex::normal(&N,(Vertex *)(*(_List_node_base **)((long)(p_Var3 + 2) + 8) + 1));
        glNormal3d(SUB84(N.x,0),N.y,N.z);
      }
      glVertex3dv((_List_node_base **)
                  ((long)(*(_List_node_base **)((long)(p_Var3 + 2) + 8) + 1) + 8));
      p_Var3 = p_Var3[2]._M_next;
    } while (p_Var3 != p_Var4[0xb]._M_prev);
    glEnd();
    if (pDVar2 != this->defaultStyle) {
      glEnable(0xb50);
    }
  }
  return;
}

Assistant:

void Mesh::draw_faces(bool smooth) const {

   GLfloat white[4] = { 1., 1., 1., 1. };
   GLfloat faceColor[4] = { 1., 1., 1., 1. };
   if (isGhosted)
   {
     faceColor[0] = faceColor[1] = faceColor[2] = faceColor[3] = 0.25;
   }
   glEnable( GL_LIGHTING );
   glEnable( GL_LIGHT0 );
   glLightfv( GL_LIGHT0, GL_DIFFUSE, white );
   if (!smooth) glMaterialfv( GL_FRONT_AND_BACK, GL_DIFFUSE, faceColor);

  for (FaceCIter f = mesh.facesBegin(); f != mesh.facesEnd(); f++) {

    // Prevent z fighting (faces bleeding into edges and points).
    glEnable(GL_POLYGON_OFFSET_FILL);
    glPolygonOffset(1.0, 1.0);

    DrawStyle* style = get_draw_style(elementAddress(f));
    if (!smooth) {
      if (style != defaultStyle) {
        glDisable(GL_LIGHTING);
        style->style_face();
      }
    }

    glBegin(GL_POLYGON);
    Vector3D normal(f->normal());
    if (!smooth) glNormal3dv(&normal.x);
    HalfedgeCIter h = f->halfedge();
    do {
      if (smooth) {
        Vector3D N = h->vertex()->normal();
        glNormal3d(N.x, N.y, N.z);
      }
      glVertex3dv(&h->vertex()->position.x);
      h = h->next();
    } while (h != f->halfedge());
    glEnd();

    if (style != defaultStyle) {
      glEnable(GL_LIGHTING);
    }
  }
}